

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

char * fmt_bit_array(bit_array_t *bit_array)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  byte_t *pbVar4;
  
  uVar1 = bit_array->length;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = uVar1 - 1;
    if (0xfd < uVar2) {
      uVar2 = 0xfe;
    }
    pbVar4 = bit_array->buffer + ((ulong)(uint)uVar1 - 1);
    uVar3 = 0;
    do {
      fmt_bit_array::str[uVar3] = *pbVar4;
      uVar3 = uVar3 + 1;
      pbVar4 = pbVar4 + -1;
    } while (uVar2 + 1 != uVar3);
  }
  fmt_bit_array::str[uVar3] = '\0';
  return fmt_bit_array::str;
}

Assistant:

char * fmt_bit_array(const bit_array_t *bit_array) {
    static char str[MAX_BIT_STR] = {0};

    int j = 0;
    for(int i = bit_array->length-1; i>=0 && (j < sizeof(str)-2); i--) {
        str[j] = bit_array->buffer[i];
        j++;
    }

    str[j] = 0;
    return str;
}